

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * cmsys::SystemTools::GetRealPath
                   (string *__return_storage_ptr__,string *path,string *errorMessage)

{
  string *errorMessage_local;
  string *path_local;
  string *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  Realpath(path,__return_storage_ptr__,errorMessage);
  return __return_storage_ptr__;
}

Assistant:

kwsys_stl::string SystemTools::GetRealPath(const kwsys_stl::string& path,
                                           kwsys_stl::string* errorMessage)
{
  kwsys_stl::string ret;
  Realpath(path, ret, errorMessage);
  return ret;
}